

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::set_disk(Drive *this,shared_ptr<Storage::Disk::Disk> *disk)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  undefined8 extraout_RDX;
  bool had_disk;
  shared_ptr<Storage::Disk::Disk> *disk_local;
  Drive *this_local;
  
  if ((this->ready_type_ == ShugartModifiedRDY) || (this->ready_type_ == IBMRDY)) {
    this->is_ready_ = false;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->disk_);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->disk_);
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->disk_);
    (*peVar3->_vptr_Disk[6])();
  }
  std::shared_ptr<Storage::Disk::Disk>::operator=(&this->disk_,disk);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->disk_);
  this->has_disk_ = bVar2;
  invalidate_track(this);
  (*(this->super_Source)._vptr_Source[4])(this,(ulong)bVar1,extraout_RDX,bVar1);
  ClockingHint::Source::update_clocking_observer(&this->super_Source);
  return;
}

Assistant:

void Drive::set_disk(const std::shared_ptr<Disk> &disk) {
	if(ready_type_ == ReadyType::ShugartModifiedRDY || ready_type_ == ReadyType::IBMRDY) {
		is_ready_ = false;
	}
	const bool had_disk = bool(disk_);
	if(disk_) disk_->flush_tracks();
	disk_ = disk;
	has_disk_ = !!disk_;

	invalidate_track();
	did_set_disk(had_disk);
	update_clocking_observer();
}